

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

char * skip_white(char *s)

{
  byte bVar1;
  ushort **ppuVar2;
  
  if (s == (char *)0x0) {
LAB_0010c406:
    s = (char *)0x0;
  }
  else {
    while( true ) {
      bVar1 = *s;
      if ((bVar1 < 0xe) && ((0x2401U >> (bVar1 & 0x1f) & 1) != 0)) goto LAB_0010c406;
      ppuVar2 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar2 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0) break;
      s = (char *)((byte *)s + 1);
    }
  }
  return (char *)(byte *)s;
}

Assistant:

static char *skip_white(char *s)
{
    if (s != NULL) {
        while (*s) {
            if (*s == '\n' || *s == '\r') {
                return NULL;
            }
            if (isspace(*s)) {
                ++s;
                continue;
            }
            return s;
        }
    }
    return NULL;
}